

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::BMPattern::BMPattern
          (BMPattern *this,XMLCh *pattern,int tableSize,bool ignoreCase,MemoryManager *manager)

{
  XMLCh *pXVar1;
  OutOfMemoryException *anon_var_0;
  undefined1 local_40 [8];
  CleanupType_conflict cleanup;
  MemoryManager *manager_local;
  bool ignoreCase_local;
  int tableSize_local;
  XMLCh *pattern_local;
  BMPattern *this_local;
  
  cleanup._16_8_ = manager;
  XMemory::XMemory((XMemory *)this);
  this->fIgnoreCase = ignoreCase;
  this->fShiftTableLen = tableSize;
  this->fShiftTable = (XMLSize_t *)0x0;
  this->fPattern = (XMLCh *)0x0;
  this->fUppercasePattern = (XMLCh *)0x0;
  this->fMemoryManager = (MemoryManager *)cleanup._16_8_;
  JanitorMemFunCall<xercesc_4_0::BMPattern>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::BMPattern> *)local_40,this,(MFPT)cleanUp);
  pXVar1 = XMLString::replicate(pattern,this->fMemoryManager);
  this->fPattern = pXVar1;
  initialize(this);
  JanitorMemFunCall<xercesc_4_0::BMPattern>::release
            ((JanitorMemFunCall<xercesc_4_0::BMPattern> *)local_40);
  JanitorMemFunCall<xercesc_4_0::BMPattern>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::BMPattern> *)local_40);
  return;
}

Assistant:

BMPattern::BMPattern( const XMLCh*         const pattern
                    ,       int                  tableSize
                    ,       bool                 ignoreCase
                    ,       MemoryManager* const manager) :

    fIgnoreCase(ignoreCase)
    , fShiftTableLen(tableSize)
    , fShiftTable(0)
    , fPattern(0)
    , fUppercasePattern(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &BMPattern::cleanUp);

    try {
        fPattern = XMLString::replicate(pattern, fMemoryManager);
        initialize();
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}